

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O0

void __thiscall
kj::UnixEventPort::ChildExitPromiseAdapter::ChildExitPromiseAdapter
          (ChildExitPromiseAdapter *this,PromiseFulfiller<int> *fulfiller,ChildSet *childSet,
          Maybe<int> *pidRef)

{
  Maybe<int> *this_00;
  int **ppiVar1;
  pair<int,_kj::UnixEventPort::ChildExitPromiseAdapter_*> pVar2;
  __enable_if_t<is_constructible<value_type,_pair<int,_ChildExitPromiseAdapter_*>_>::value,_pair<iterator,_bool>_>
  _Var3;
  Fault local_90;
  Fault f;
  ChildExitPromiseAdapter *local_78;
  pair<int,_kj::UnixEventPort::ChildExitPromiseAdapter_*> local_70;
  _Base_ptr local_60;
  undefined1 local_58;
  int *local_50;
  Fault local_38;
  int *local_30;
  int *_kj_result;
  Maybe<int> *pidRef_local;
  ChildSet *childSet_local;
  PromiseFulfiller<int> *fulfiller_local;
  ChildExitPromiseAdapter *this_local;
  
  this->childSet = childSet;
  _kj_result = (int *)pidRef;
  pidRef_local = (Maybe<int> *)childSet;
  childSet_local = (ChildSet *)fulfiller;
  fulfiller_local = (PromiseFulfiller<int> *)this;
  local_30 = _::readMaybe<int>(pidRef);
  if (local_30 == (int *)0x0) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[61]>
              (&local_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix.c++"
               ,0x80,FAILED,"pidRef != nullptr",
               "\"`pid` must be non-null at the time `onChildExit()` is called\"",
               (char (*) [61])"`pid` must be non-null at the time `onChildExit()` is called");
    _::Debug::Fault::fatal(&local_38);
  }
  ppiVar1 = mv<int*>(&local_30);
  this_00 = pidRef_local;
  local_50 = *ppiVar1;
  this->pid = *local_50;
  this->pidRef = (Maybe<int> *)_kj_result;
  this->fulfiller = (PromiseFulfiller<int> *)childSet_local;
  local_78 = this;
  pVar2 = std::make_pair<int&,kj::UnixEventPort::ChildExitPromiseAdapter*>(&this->pid,&local_78);
  local_70.second = pVar2.second;
  local_70.first = pVar2.first;
  _Var3 = std::
          map<int,kj::UnixEventPort::ChildExitPromiseAdapter*,std::less<int>,std::allocator<std::pair<int_const,kj::UnixEventPort::ChildExitPromiseAdapter*>>>
          ::insert<std::pair<int,kj::UnixEventPort::ChildExitPromiseAdapter*>>
                    ((map<int,kj::UnixEventPort::ChildExitPromiseAdapter*,std::less<int>,std::allocator<std::pair<int_const,kj::UnixEventPort::ChildExitPromiseAdapter*>>>
                      *)this_00,&local_70);
  f.exception = (Exception *)_Var3.first._M_node;
  local_58 = _Var3.second;
  if (((undefined1  [16])_Var3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    return;
  }
  local_60 = (_Base_ptr)f.exception;
  _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[42]>
            (&local_90,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix.c++"
             ,0x83,FAILED,"childSet.waiters.insert(std::make_pair(pid, this)).second",
             "\"already called onChildExit() for this pid\"",
             (char (*) [42])"already called onChildExit() for this pid");
  _::Debug::Fault::fatal(&local_90);
}

Assistant:

inline ChildExitPromiseAdapter(PromiseFulfiller<int>& fulfiller,
                                 ChildSet& childSet, Maybe<pid_t>& pidRef)
      : childSet(childSet),
        pid(KJ_REQUIRE_NONNULL(pidRef,
            "`pid` must be non-null at the time `onChildExit()` is called")),
        pidRef(pidRef), fulfiller(fulfiller) {
    KJ_REQUIRE(childSet.waiters.insert(std::make_pair(pid, this)).second,
        "already called onChildExit() for this pid");
  }